

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
dynet::Softmax::forward_dev_impl<dynet::Device_CPU>
          (Softmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  Tensor *pTVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  StorageIndex i;
  long lVar11;
  ulong uVar12;
  runtime_error *this_00;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ushort uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  uint uVar44;
  float fVar45;
  undefined1 extraout_var [60];
  undefined1 auVar46 [64];
  type tStack_158;
  undefined1 local_108 [48];
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_d8;
  Device *local_c0;
  DeviceMempool local_b8;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
  local_b0;
  type local_a0;
  undefined1 local_88 [48];
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_58;
  Device *local_40;
  DeviceMempool local_38;
  
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar1->d).nd) && ((pTVar1->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Softmax not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_108._40_8_ = (this->super_Node).aux_mem;
  local_108._32_4_ = (fx->d).bd;
  local_c0 = fx->device;
  local_108._0_4_ = 1;
  local_88._0_4_ = 1;
  local_88._20_4_ =
       (undefined4)tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
  local_88._24_4_ =
       (undefined4)
       ((ulong)tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] >> 0x20);
  local_88._4_4_ = SUB84(tStack_158.m_xpr.m_lhs_xpr.m_data,0);
  local_88._8_4_ = (undefined4)((ulong)tStack_158.m_xpr.m_lhs_xpr.m_data >> 0x20);
  local_88._12_4_ =
       (undefined4)tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
  local_88._16_4_ =
       (undefined4)
       ((ulong)tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] >> 0x20);
  local_88._28_4_ = 1;
  local_108._28_4_ = 1;
  local_88._40_8_ = local_108._40_8_ + (ulong)(uint)local_108._32_4_ * 4;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = FXS;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = FXS;
  local_88._32_4_ = local_108._32_4_;
  local_40 = local_c0;
  logsumexp<dynet::Device_CPU>(dev,pTVar1,(Tensor *)local_88,(Tensor *)local_108);
  lVar11 = (long)(int)(fx->d).bd;
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (lVar11 == 1) {
    if ((pTVar1->d).bd != 1) {
LAB_0035552a:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xba,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t() const"
                   );
    }
    uVar44 = (pTVar1->d).nd;
    if ((ulong)uVar44 == 0) {
      uVar19 = 1;
      if ((pTVar1->d).d[0] != 1) goto LAB_0035552a;
    }
    else {
      if (uVar44 == 1) {
        uVar44 = (pTVar1->d).d[0];
      }
      else {
        auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar46);
          auVar46 = vporq_avx512f(auVar26,auVar23);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar46,auVar25,2);
          bVar8 = (byte)uVar6;
          uVar20 = CONCAT11(bVar8,bVar7);
          auVar46 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar19));
          auVar30._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar46._4_4_;
          auVar30._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar46._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar46._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar46._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar46._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar46._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar46._28_4_;
          auVar30._32_4_ = (uint)(bVar8 & 1) * auVar46._32_4_;
          auVar30._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar46._36_4_;
          auVar30._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar46._40_4_;
          auVar30._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar46._44_4_;
          auVar30._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar46._48_4_;
          auVar30._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar46._52_4_;
          auVar30._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar46._56_4_;
          auVar30._60_4_ = (uint)(bVar8 >> 7) * auVar46._60_4_;
          uVar19 = uVar19 + 0x10;
          auVar46 = vpmulld_avx512f(auVar30,auVar27);
        } while (((ulong)uVar44 + 0xf & 0xfffffffffffffff0) != uVar19);
        auVar46 = vmovdqa32_avx512f(auVar46);
        auVar25._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_
        ;
        bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar3 * auVar46._4_4_ | (uint)!bVar3 * auVar27._4_4_;
        bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar3 * auVar46._8_4_ | (uint)!bVar3 * auVar27._8_4_;
        bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar3 * auVar46._12_4_ | (uint)!bVar3 * auVar27._12_4_;
        bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar25._16_4_ = (uint)bVar3 * auVar46._16_4_ | (uint)!bVar3 * auVar27._16_4_;
        bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar25._20_4_ = (uint)bVar3 * auVar46._20_4_ | (uint)!bVar3 * auVar27._20_4_;
        bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar25._24_4_ = (uint)bVar3 * auVar46._24_4_ | (uint)!bVar3 * auVar27._24_4_;
        bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar25._28_4_ = (uint)bVar3 * auVar46._28_4_ | (uint)!bVar3 * auVar27._28_4_;
        auVar25._32_4_ =
             (uint)(bVar8 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar25._36_4_ = (uint)bVar3 * auVar46._36_4_ | (uint)!bVar3 * auVar27._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar25._40_4_ = (uint)bVar3 * auVar46._40_4_ | (uint)!bVar3 * auVar27._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar25._44_4_ = (uint)bVar3 * auVar46._44_4_ | (uint)!bVar3 * auVar27._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar25._48_4_ = (uint)bVar3 * auVar46._48_4_ | (uint)!bVar3 * auVar27._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar25._52_4_ = (uint)bVar3 * auVar46._52_4_ | (uint)!bVar3 * auVar27._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar25._56_4_ = (uint)bVar3 * auVar46._56_4_ | (uint)!bVar3 * auVar27._56_4_;
        auVar25._60_4_ =
             (uint)(bVar8 >> 7) * auVar46._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar25,1);
        auVar46 = vpmulld_avx512f(auVar25,ZEXT3264(auVar22));
        auVar21 = vpmulld_avx(auVar46._0_16_,auVar46._16_16_);
        auVar4 = vpshufd_avx(auVar21,0xee);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        auVar4 = vpshufd_avx(auVar21,0x55);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        uVar44 = auVar21._0_4_;
        if (uVar44 != (pTVar1->d).d[0]) goto LAB_0035552a;
      }
      uVar19 = (ulong)(int)uVar44;
    }
    pfVar14 = pTVar1->v;
    auVar27._0_4_ = as_scalar((Tensor *)local_108);
    auVar27._4_60_ = extraout_var;
    if ((fx->d).bd != 1) {
LAB_0035554c:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xb6,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t()");
    }
    uVar44 = (fx->d).nd;
    auVar21 = vmovdqa64_avx512vl(auVar27._0_16_);
    auVar46 = ZEXT1664(auVar21);
    if ((ulong)uVar44 == 0) {
      uVar12 = 1;
      if ((fx->d).d[0] != 1) goto LAB_0035554c;
    }
    else {
      if (uVar44 == 1) {
        uVar44 = (fx->d).d[0];
      }
      else {
        auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26 = vpbroadcastq_avx512f();
        uVar12 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vmovdqa64_avx512f(auVar23);
          auVar23 = vporq_avx512f(auVar27,auVar24);
          auVar27 = vporq_avx512f(auVar27,auVar25);
          uVar6 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar23,auVar26,2);
          bVar8 = (byte)uVar6;
          uVar20 = CONCAT11(bVar8,bVar7);
          auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar12));
          auVar31._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar23._4_4_;
          auVar31._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_;
          auVar31._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar23._8_4_;
          auVar31._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar23._12_4_;
          auVar31._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar23._16_4_;
          auVar31._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar23._20_4_;
          auVar31._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar23._24_4_;
          auVar31._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar23._28_4_;
          auVar31._32_4_ = (uint)(bVar8 & 1) * auVar23._32_4_;
          auVar31._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar23._36_4_;
          auVar31._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar23._40_4_;
          auVar31._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar23._44_4_;
          auVar31._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar23._48_4_;
          auVar31._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar23._52_4_;
          auVar31._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar23._56_4_;
          auVar31._60_4_ = (uint)(bVar8 >> 7) * auVar23._60_4_;
          uVar12 = uVar12 + 0x10;
          auVar23 = vpmulld_avx512f(auVar31,auVar28);
        } while (((ulong)uVar44 + 0xf & 0xfffffffffffffff0) != uVar12);
        auVar23 = vmovdqa32_avx512f(auVar23);
        auVar32._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar28._0_4_
        ;
        bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar28._4_4_;
        bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar28._8_4_;
        bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar28._12_4_;
        bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar32._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar28._16_4_;
        bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar32._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar28._20_4_;
        bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar32._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar28._24_4_;
        bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar32._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar28._28_4_;
        auVar32._32_4_ =
             (uint)(bVar8 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar28._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar32._36_4_ = (uint)bVar3 * auVar23._36_4_ | (uint)!bVar3 * auVar28._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar32._40_4_ = (uint)bVar3 * auVar23._40_4_ | (uint)!bVar3 * auVar28._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar32._44_4_ = (uint)bVar3 * auVar23._44_4_ | (uint)!bVar3 * auVar28._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar32._48_4_ = (uint)bVar3 * auVar23._48_4_ | (uint)!bVar3 * auVar28._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar32._52_4_ = (uint)bVar3 * auVar23._52_4_ | (uint)!bVar3 * auVar28._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar32._56_4_ = (uint)bVar3 * auVar23._56_4_ | (uint)!bVar3 * auVar28._56_4_;
        auVar32._60_4_ =
             (uint)(bVar8 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar28._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar32,1);
        auVar23 = vpmulld_avx512f(auVar32,ZEXT3264(auVar22));
        auVar4 = vpmulld_avx(auVar23._0_16_,auVar23._16_16_);
        auVar5 = vpshufd_avx(auVar4,0xee);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        auVar5 = vpshufd_avx(auVar4,0x55);
        auVar4 = vpmulld_avx(auVar4,auVar5);
        uVar44 = auVar4._0_4_;
        if (uVar44 != (fx->d).d[0]) goto LAB_0035554c;
      }
      uVar12 = (ulong)(int)uVar44;
    }
    pfVar2 = fx->v;
    uVar44 = auVar21._0_4_;
    tStack_158.m_xpr.m_lhs_xpr.m_data =
         (StoragePointerType)CONCAT44(tStack_158.m_xpr.m_lhs_xpr.m_data._4_4_,uVar44);
    tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)pfVar14;
    if (uVar12 != uVar19) {
      __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                    "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorAssign.h",0x92,
                    "bool Eigen::TensorEvaluator<const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>, Eigen::DefaultDevice>::evalSubExprsIfNeeded(EvaluatorPointerType) [Derived = const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>, Device = Eigen::DefaultDevice]"
                   );
    }
    iVar9 = (int)uVar19;
    iVar10 = iVar9 + 0x3f;
    if (-1 < iVar9) {
      iVar10 = iVar9;
    }
    lVar11 = (long)(iVar10 >> 6) * 0x40;
    if (0x3f < (long)uVar19) {
      auVar23 = vbroadcastss_avx512f(ZEXT416(uVar44));
      auVar24 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar25 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar26 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar27 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar28 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar29 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar30 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar32 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar34 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar35 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      lVar13 = 0;
      pfVar15 = pfVar14;
      pfVar16 = pfVar2;
      do {
        lVar18 = 0;
        do {
          auVar36 = vsubps_avx512f(*(undefined1 (*) [64])((long)pfVar15 + lVar18),auVar23);
          auVar37 = vminps_avx512f(auVar36,auVar24);
          auVar37 = vmaxps_avx512f(auVar37,auVar25);
          auVar38 = vfmadd231ps_avx512f(auVar26,auVar37,auVar27);
          auVar38 = vrndscaleps_avx512f(auVar38,1);
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar38,auVar28);
          auVar39 = vfmadd213ps_avx512f(auVar29,auVar37,auVar30);
          auVar40 = vfmadd213ps_avx512f(auVar31,auVar37,auVar32);
          auVar41 = vmulps_avx512f(auVar37,auVar37);
          auVar42 = vaddps_avx512f(auVar37,auVar33);
          auVar43 = vmulps_avx512f(auVar41,auVar37);
          auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,auVar34);
          auVar37 = vfmadd213ps_avx512f(auVar40,auVar37,auVar26);
          auVar38 = vaddps_avx512f(auVar38,auVar35);
          auVar38 = vcvttps2dq_avx512f(auVar38);
          auVar37 = vfmadd231ps_avx512f(auVar37,auVar43,auVar39);
          auVar38 = vpslld_avx512f(auVar38,0x17);
          auVar37 = vfmadd213ps_avx512f(auVar37,auVar41,auVar42);
          auVar37 = vmulps_avx512f(auVar37,auVar38);
          auVar36 = vmaxps_avx512f(auVar36,auVar37);
          *(undefined1 (*) [64])((long)pfVar16 + lVar18) = auVar36;
          lVar18 = lVar18 + 0x40;
        } while (lVar18 != 0x100);
        lVar13 = lVar13 + 0x40;
        pfVar16 = pfVar16 + 0x40;
        pfVar15 = pfVar15 + 0x40;
      } while (lVar13 < lVar11);
    }
    uVar12 = uVar19 + 0xf;
    if (-1 < (long)uVar19) {
      uVar12 = uVar19;
    }
    uVar12 = uVar12 & 0xfffffffffffffff0;
    if (lVar11 < (long)uVar12) {
      auVar23 = vbroadcastss_avx512f(ZEXT416(uVar44));
      auVar24 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar25 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar26 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar27 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar28 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar29 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar30 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar32 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar34 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar35 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      do {
        auVar36 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar14 + lVar11),auVar23);
        auVar37 = vminps_avx512f(auVar36,auVar24);
        auVar37 = vmaxps_avx512f(auVar37,auVar25);
        auVar38 = vfmadd231ps_avx512f(auVar26,auVar37,auVar27);
        auVar38 = vrndscaleps_avx512f(auVar38,1);
        auVar37 = vfmadd231ps_avx512f(auVar37,auVar38,auVar28);
        auVar39 = vfmadd213ps_avx512f(auVar29,auVar37,auVar30);
        auVar40 = vfmadd213ps_avx512f(auVar31,auVar37,auVar32);
        auVar41 = vmulps_avx512f(auVar37,auVar37);
        auVar42 = vaddps_avx512f(auVar37,auVar33);
        auVar43 = vmulps_avx512f(auVar41,auVar37);
        auVar39 = vfmadd213ps_avx512f(auVar39,auVar37,auVar34);
        auVar37 = vfmadd213ps_avx512f(auVar40,auVar37,auVar26);
        auVar38 = vaddps_avx512f(auVar38,auVar35);
        auVar38 = vcvttps2dq_avx512f(auVar38);
        auVar37 = vfmadd231ps_avx512f(auVar37,auVar43,auVar39);
        auVar38 = vpslld_avx512f(auVar38,0x17);
        auVar37 = vfmadd213ps_avx512f(auVar37,auVar41,auVar42);
        auVar37 = vmulps_avx512f(auVar37,auVar38);
        auVar36 = vmaxps_avx512f(auVar36,auVar37);
        *(undefined1 (*) [64])(pfVar2 + lVar11) = auVar36;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 < (long)uVar12);
    }
    if ((long)uVar12 < (long)uVar19) {
      if (pfVar14 == (float *)0x0) {
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",
                      0x123,
                      "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                     );
      }
      if (pfVar2 == (float *)0x0) {
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100
                      ,
                      "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                     );
      }
      do {
        auVar21 = vsubss_avx512f(ZEXT416((uint)pfVar14[uVar12]),auVar46._0_16_);
        fVar45 = expf(auVar21._0_4_);
        auVar46 = ZEXT464(uVar44);
        pfVar2[uVar12] = fVar45;
        uVar12 = uVar12 + 1;
      } while (uVar19 != uVar12);
    }
  }
  else {
    uVar44 = (pTVar1->d).d[0];
    pfVar14 = (float *)(long)(int)uVar44;
    uVar17 = (pTVar1->d).nd;
    if ((ulong)uVar17 == 0) {
      pfVar14 = (float *)0x1;
      if (uVar44 != 1) {
LAB_00354d7c:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xf0,
                      "const Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb() const");
      }
    }
    else if (uVar17 != 1) {
      auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar25 = vpbroadcastq_avx512f();
      uVar19 = 0;
      do {
        auVar26 = vpbroadcastq_avx512f();
        auVar27 = vmovdqa64_avx512f(auVar46);
        auVar46 = vporq_avx512f(auVar26,auVar23);
        auVar26 = vporq_avx512f(auVar26,auVar24);
        uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar46,auVar25,2);
        bVar8 = (byte)uVar6;
        uVar20 = CONCAT11(bVar8,bVar7);
        auVar46 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar1->d).d + uVar19));
        auVar26._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar46._4_4_;
        auVar26._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_;
        auVar26._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar46._8_4_;
        auVar26._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar46._12_4_;
        auVar26._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar46._16_4_;
        auVar26._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar46._20_4_;
        auVar26._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar46._24_4_;
        auVar26._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar46._28_4_;
        auVar26._32_4_ = (uint)(bVar8 & 1) * auVar46._32_4_;
        auVar26._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar46._36_4_;
        auVar26._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar46._40_4_;
        auVar26._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar46._44_4_;
        auVar26._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar46._48_4_;
        auVar26._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar46._52_4_;
        auVar26._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar46._56_4_;
        auVar26._60_4_ = (uint)(bVar8 >> 7) * auVar46._60_4_;
        uVar19 = uVar19 + 0x10;
        auVar46 = vpmulld_avx512f(auVar26,auVar27);
      } while (((ulong)uVar17 + 0xf & 0xfffffffffffffff0) != uVar19);
      auVar23 = vmovdqa32_avx512f(auVar46);
      auVar46._0_4_ = (uint)(bVar7 & 1) * auVar23._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_;
      bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
      auVar46._4_4_ = (uint)bVar3 * auVar23._4_4_ | (uint)!bVar3 * auVar27._4_4_;
      bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
      auVar46._8_4_ = (uint)bVar3 * auVar23._8_4_ | (uint)!bVar3 * auVar27._8_4_;
      bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
      auVar46._12_4_ = (uint)bVar3 * auVar23._12_4_ | (uint)!bVar3 * auVar27._12_4_;
      bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
      auVar46._16_4_ = (uint)bVar3 * auVar23._16_4_ | (uint)!bVar3 * auVar27._16_4_;
      bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
      auVar46._20_4_ = (uint)bVar3 * auVar23._20_4_ | (uint)!bVar3 * auVar27._20_4_;
      bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
      auVar46._24_4_ = (uint)bVar3 * auVar23._24_4_ | (uint)!bVar3 * auVar27._24_4_;
      bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
      auVar46._28_4_ = (uint)bVar3 * auVar23._28_4_ | (uint)!bVar3 * auVar27._28_4_;
      auVar46._32_4_ =
           (uint)(bVar8 & 1) * auVar23._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar46._36_4_ = (uint)bVar3 * auVar23._36_4_ | (uint)!bVar3 * auVar27._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar46._40_4_ = (uint)bVar3 * auVar23._40_4_ | (uint)!bVar3 * auVar27._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar46._44_4_ = (uint)bVar3 * auVar23._44_4_ | (uint)!bVar3 * auVar27._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar46._48_4_ = (uint)bVar3 * auVar23._48_4_ | (uint)!bVar3 * auVar27._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar46._52_4_ = (uint)bVar3 * auVar23._52_4_ | (uint)!bVar3 * auVar27._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar46._56_4_ = (uint)bVar3 * auVar23._56_4_ | (uint)!bVar3 * auVar27._56_4_;
      auVar46._60_4_ =
           (uint)(bVar8 >> 7) * auVar23._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
      auVar22 = vextracti64x4_avx512f(auVar46,1);
      auVar46 = vpmulld_avx512f(auVar46,ZEXT3264(auVar22));
      auVar21 = vpmulld_avx(auVar46._0_16_,auVar46._16_16_);
      auVar4 = vpshufd_avx(auVar21,0xee);
      auVar21 = vpmulld_avx(auVar21,auVar4);
      auVar4 = vpshufd_avx(auVar21,0x55);
      auVar21 = vpmulld_avx(auVar21,auVar4);
      if (auVar21._0_4_ != uVar44) goto LAB_00354d7c;
    }
    pfVar2 = pTVar1->v;
    lVar13 = (long)(int)(pTVar1->d).bd;
    if ((ulong)(uint)local_108._28_4_ == 0) {
      lVar18 = 1;
      if (local_108._0_4_ != 1) goto LAB_0035556e;
    }
    else {
      uVar17 = local_108._0_4_;
      if (local_108._28_4_ != 1) {
        auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar46);
          auVar46 = vporq_avx512f(auVar26,auVar23);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar46,auVar25,2);
          bVar8 = (byte)uVar6;
          uVar20 = CONCAT11(bVar8,bVar7);
          auVar46 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_108 + uVar19 * 4));
          auVar28._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar46._4_4_;
          auVar28._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_;
          auVar28._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar46._8_4_;
          auVar28._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar46._12_4_;
          auVar28._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar46._16_4_;
          auVar28._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar46._20_4_;
          auVar28._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar46._24_4_;
          auVar28._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar46._28_4_;
          auVar28._32_4_ = (uint)(bVar8 & 1) * auVar46._32_4_;
          auVar28._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar46._36_4_;
          auVar28._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar46._40_4_;
          auVar28._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar46._44_4_;
          auVar28._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar46._48_4_;
          auVar28._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar46._52_4_;
          auVar28._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar46._56_4_;
          auVar28._60_4_ = (uint)(bVar8 >> 7) * auVar46._60_4_;
          uVar19 = uVar19 + 0x10;
          auVar46 = vpmulld_avx512f(auVar28,auVar27);
        } while (((ulong)(uint)local_108._28_4_ + 0xf & 0xfffffffffffffff0) != uVar19);
        auVar46 = vmovdqa32_avx512f(auVar46);
        auVar23._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_
        ;
        bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar23._4_4_ = (uint)bVar3 * auVar46._4_4_ | (uint)!bVar3 * auVar27._4_4_;
        bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar23._8_4_ = (uint)bVar3 * auVar46._8_4_ | (uint)!bVar3 * auVar27._8_4_;
        bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar23._12_4_ = (uint)bVar3 * auVar46._12_4_ | (uint)!bVar3 * auVar27._12_4_;
        bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar23._16_4_ = (uint)bVar3 * auVar46._16_4_ | (uint)!bVar3 * auVar27._16_4_;
        bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar23._20_4_ = (uint)bVar3 * auVar46._20_4_ | (uint)!bVar3 * auVar27._20_4_;
        bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar23._24_4_ = (uint)bVar3 * auVar46._24_4_ | (uint)!bVar3 * auVar27._24_4_;
        bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar23._28_4_ = (uint)bVar3 * auVar46._28_4_ | (uint)!bVar3 * auVar27._28_4_;
        auVar23._32_4_ =
             (uint)(bVar8 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar23._36_4_ = (uint)bVar3 * auVar46._36_4_ | (uint)!bVar3 * auVar27._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar23._40_4_ = (uint)bVar3 * auVar46._40_4_ | (uint)!bVar3 * auVar27._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar23._44_4_ = (uint)bVar3 * auVar46._44_4_ | (uint)!bVar3 * auVar27._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar23._48_4_ = (uint)bVar3 * auVar46._48_4_ | (uint)!bVar3 * auVar27._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar23._52_4_ = (uint)bVar3 * auVar46._52_4_ | (uint)!bVar3 * auVar27._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar23._56_4_ = (uint)bVar3 * auVar46._56_4_ | (uint)!bVar3 * auVar27._56_4_;
        auVar23._60_4_ =
             (uint)(bVar8 >> 7) * auVar46._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar23,1);
        auVar46 = vpmulld_avx512f(auVar23,ZEXT3264(auVar22));
        auVar21 = vpmulld_avx(auVar46._0_16_,auVar46._16_16_);
        auVar4 = vpshufd_avx(auVar21,0xee);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        auVar4 = vpshufd_avx(auVar21,0x55);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        uVar17 = auVar21._0_4_;
        if (auVar21._0_4_ != local_108._0_4_) goto LAB_0035556e;
      }
      lVar18 = (long)(int)uVar17;
    }
    tStack_158.m_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         (long)(int)local_108._32_4_;
    tStack_158.m_xpr.m_rhs_xpr.m_broadcast._M_elems = (_Type)((ulong)uVar44 | 0x100000000);
    tStack_158.m_xpr.m_rhs_xpr.m_xpr.m_data = (StoragePointerType)local_108._40_8_;
    uVar44 = (fx->d).nd;
    tStack_158.m_xpr.m_lhs_xpr.m_data = pfVar2;
    tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)pfVar14;
    tStack_158.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = lVar13;
    tStack_158.m_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = lVar18;
    if ((ulong)uVar44 == 0) {
      local_a0.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
      if ((fx->d).d[0] != 1) {
LAB_0035556e:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xec,"Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb()");
      }
    }
    else {
      if (uVar44 == 1) {
        uVar44 = (fx->d).d[0];
      }
      else {
        auVar46 = vpbroadcastd_avx512f(ZEXT416(1));
        auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar25 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar26 = vpbroadcastq_avx512f();
          auVar27 = vmovdqa64_avx512f(auVar46);
          auVar46 = vporq_avx512f(auVar26,auVar23);
          auVar26 = vporq_avx512f(auVar26,auVar24);
          uVar6 = vpcmpuq_avx512f(auVar26,auVar25,2);
          bVar7 = (byte)uVar6;
          uVar6 = vpcmpuq_avx512f(auVar46,auVar25,2);
          bVar8 = (byte)uVar6;
          uVar20 = CONCAT11(bVar8,bVar7);
          auVar46 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar19));
          auVar29._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar46._4_4_;
          auVar29._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar46._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar46._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar46._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar46._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar46._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar20 >> 7) & 1) * auVar46._28_4_;
          auVar29._32_4_ = (uint)(bVar8 & 1) * auVar46._32_4_;
          auVar29._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar46._36_4_;
          auVar29._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar46._40_4_;
          auVar29._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar46._44_4_;
          auVar29._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar46._48_4_;
          auVar29._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar46._52_4_;
          auVar29._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar46._56_4_;
          auVar29._60_4_ = (uint)(bVar8 >> 7) * auVar46._60_4_;
          uVar19 = uVar19 + 0x10;
          auVar46 = vpmulld_avx512f(auVar29,auVar27);
        } while (((ulong)uVar44 + 0xf & 0xfffffffffffffff0) != uVar19);
        auVar46 = vmovdqa32_avx512f(auVar46);
        auVar24._0_4_ = (uint)(bVar7 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar27._0_4_
        ;
        bVar3 = (bool)((byte)(uVar20 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar3 * auVar46._4_4_ | (uint)!bVar3 * auVar27._4_4_;
        bVar3 = (bool)((byte)(uVar20 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar3 * auVar46._8_4_ | (uint)!bVar3 * auVar27._8_4_;
        bVar3 = (bool)((byte)(uVar20 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar3 * auVar46._12_4_ | (uint)!bVar3 * auVar27._12_4_;
        bVar3 = (bool)((byte)(uVar20 >> 4) & 1);
        auVar24._16_4_ = (uint)bVar3 * auVar46._16_4_ | (uint)!bVar3 * auVar27._16_4_;
        bVar3 = (bool)((byte)(uVar20 >> 5) & 1);
        auVar24._20_4_ = (uint)bVar3 * auVar46._20_4_ | (uint)!bVar3 * auVar27._20_4_;
        bVar3 = (bool)((byte)(uVar20 >> 6) & 1);
        auVar24._24_4_ = (uint)bVar3 * auVar46._24_4_ | (uint)!bVar3 * auVar27._24_4_;
        bVar3 = (bool)((byte)(uVar20 >> 7) & 1);
        auVar24._28_4_ = (uint)bVar3 * auVar46._28_4_ | (uint)!bVar3 * auVar27._28_4_;
        auVar24._32_4_ =
             (uint)(bVar8 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar27._32_4_;
        bVar3 = (bool)(bVar8 >> 1 & 1);
        auVar24._36_4_ = (uint)bVar3 * auVar46._36_4_ | (uint)!bVar3 * auVar27._36_4_;
        bVar3 = (bool)(bVar8 >> 2 & 1);
        auVar24._40_4_ = (uint)bVar3 * auVar46._40_4_ | (uint)!bVar3 * auVar27._40_4_;
        bVar3 = (bool)(bVar8 >> 3 & 1);
        auVar24._44_4_ = (uint)bVar3 * auVar46._44_4_ | (uint)!bVar3 * auVar27._44_4_;
        bVar3 = (bool)(bVar8 >> 4 & 1);
        auVar24._48_4_ = (uint)bVar3 * auVar46._48_4_ | (uint)!bVar3 * auVar27._48_4_;
        bVar3 = (bool)(bVar8 >> 5 & 1);
        auVar24._52_4_ = (uint)bVar3 * auVar46._52_4_ | (uint)!bVar3 * auVar27._52_4_;
        bVar3 = (bool)(bVar8 >> 6 & 1);
        auVar24._56_4_ = (uint)bVar3 * auVar46._56_4_ | (uint)!bVar3 * auVar27._56_4_;
        auVar24._60_4_ =
             (uint)(bVar8 >> 7) * auVar46._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar27._60_4_;
        auVar22 = vextracti64x4_avx512f(auVar24,1);
        auVar46 = vpmulld_avx512f(auVar24,ZEXT3264(auVar22));
        auVar21 = vpmulld_avx(auVar46._0_16_,auVar46._16_16_);
        auVar4 = vpshufd_avx(auVar21,0xee);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        auVar4 = vpshufd_avx(auVar21,0x55);
        auVar21 = vpmulld_avx(auVar21,auVar4);
        uVar44 = auVar21._0_4_;
        if (uVar44 != (fx->d).d[0]) goto LAB_0035556e;
      }
      local_a0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar44;
    }
    local_a0.m_data = fx->v;
    local_b0.m_lhs_xpr = &local_a0;
    local_b0.m_rhs_xpr = &tStack_158;
    local_a0.m_dimensions.super_array<long,_2>._M_elems[1] = lVar11;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run(&local_b0,dev->edevice);
  }
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_58);
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_d8);
  return;
}

Assistant:

void Softmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() != 1)
    throw std::runtime_error("Softmax not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  Tensor m(Dim({1},fx.d.bd), (float*)aux_mem + fx.d.bd, fx.device, DeviceMempool::FXS);
  logsumexp(dev, *xs[0], m, z);
  if(fx.d.bd == 1) {
    fx.t<1>().device(*dev.edevice) = (xs[0]->t<1>() - as_scalar(z)).exp();
  } else {
    Eigen::array<int, 2> bcast; bcast[0] = xs[0]->d.rows(); bcast[1] = 1;
    fx.tb<1>().device(*dev.edevice) = (xs[0]->tb<1>() - z.tb<1>().broadcast(bcast)).exp();
  }
}